

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O2

char * CVmObjBigNum::parse_str_alo(size_t *buflen,char *str,size_t len,int radix)

{
  int iVar1;
  char *ext;
  ulong uVar2;
  uint16_t tmp;
  
  iVar1 = precision_from_string(str,len,radix);
  uVar2 = ((long)iVar1 + 1U >> 1) + 5;
  *buflen = uVar2;
  ext = (char *)operator_new__(uVar2);
  *(short *)ext = (short)iVar1;
  parse_str_into(ext,str,len,radix);
  return ext;
}

Assistant:

char *CVmObjBigNum::parse_str_alo(size_t &buflen,
                                  const char *str, size_t len, int radix)
{
    /* figure the precision */
    int prec = precision_from_string(str, len, radix);

    /* allocate a buffer */
    char *ext = new char[buflen = calc_alloc(prec)];
    set_prec(ext, prec);

    /* parse the number */
    parse_str_into(ext, str, len, radix);

    /* return the new buffer */
    return ext;
}